

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxDumper.h
# Opt level: O2

Action __thiscall
psy::C::SyntaxDumper::visitExtGNU_AttributeSpecifier
          (SyntaxDumper *this,ExtGNU_AttributeSpecifierSyntax *node)

{
  ExtGNU_AttributeListSyntax *pEVar1;
  ExtGNU_AttributeListSyntax **ppEVar2;
  SyntaxToken local_50;
  
  ExtGNU_AttributeSpecifierSyntax::attributeKeyword(&local_50,node);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&local_50,node);
  SyntaxToken::~SyntaxToken(&local_50);
  ExtGNU_AttributeSpecifierSyntax::openOuterParenthesisToken(&local_50,node);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&local_50,node);
  SyntaxToken::~SyntaxToken(&local_50);
  ExtGNU_AttributeSpecifierSyntax::openInnerParenthesisToken(&local_50,node);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&local_50,node);
  SyntaxToken::~SyntaxToken(&local_50);
  ppEVar2 = &node->attrs_;
  while (pEVar1 = *ppEVar2, pEVar1 != (ExtGNU_AttributeListSyntax *)0x0) {
    (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5e])
              (this,(pEVar1->
                    super_CoreSyntaxNodeList<psy::C::ExtGNU_AttributeSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::ExtGNU_AttributeSyntax_*>_>
                    ).
                    super_List<psy::C::ExtGNU_AttributeSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::ExtGNU_AttributeSyntax_*>_>
                    .value);
    ppEVar2 = &(pEVar1->
               super_CoreSyntaxNodeList<psy::C::ExtGNU_AttributeSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::ExtGNU_AttributeSyntax_*>_>
               ).
               super_List<psy::C::ExtGNU_AttributeSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::ExtGNU_AttributeSyntax_*>_>
               .next;
  }
  ExtGNU_AttributeSpecifierSyntax::closeInnerParenthesisToken(&local_50,node);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&local_50,node);
  SyntaxToken::~SyntaxToken(&local_50);
  ExtGNU_AttributeSpecifierSyntax::closeOuterParenthesisToken(&local_50,node);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&local_50,node);
  SyntaxToken::~SyntaxToken(&local_50);
  return Skip;
}

Assistant:

virtual Action visitExtGNU_AttributeSpecifier(const ExtGNU_AttributeSpecifierSyntax* node) override
    {
        terminal(node->attributeKeyword(), node);
        terminal(node->openOuterParenthesisToken(), node);
        terminal(node->openInnerParenthesisToken(), node);
        for (auto iter = node->attributes(); iter; iter = iter->next)
            nonterminal(iter->value);
        terminal(node->closeInnerParenthesisToken(), node);
        terminal(node->closeOuterParenthesisToken(), node);
        return Action::Skip;
    }